

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

size_type __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
::erase_unique<std::tuple<float,std::__cxx11::string>>
          (btree<phmap::priv::set_params<std::tuple<float,std::__cxx11::string>,phmap::Less<std::tuple<float,std::__cxx11::string>>,std::allocator<std::tuple<float,std::__cxx11::string>>,256,false>>
           *this,tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *key)

{
  bool bVar1;
  iterator iter;
  
  iter = internal_find<std::tuple<float,std::__cxx11::string>>(this,key);
  bVar1 = iter.node !=
          (btree_node<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
           *)0x0;
  if (bVar1) {
    btree<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
    ::erase((btree<phmap::priv::set_params<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Less<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
             *)this,iter);
  }
  return (ulong)bVar1;
}

Assistant:

auto btree<P>::erase_unique(const K &key) -> size_type {
        const iterator iter = internal_find(key);
        if (iter.node == nullptr) {
            // The key doesn't exist in the tree, return nothing done.
            return 0;
        }
        erase(iter);
        return 1;
    }